

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.cc
# Opt level: O2

void __thiscall LinePrinter::PrintOrBuffer(LinePrinter *this,char *data,size_t size)

{
  if (this->console_locked_ == true) {
    std::__cxx11::string::append((char *)&this->output_buffer_,(ulong)data);
    return;
  }
  fwrite(data,1,size,_stdout);
  return;
}

Assistant:

void LinePrinter::PrintOrBuffer(const char* data, size_t size) {
  if (console_locked_) {
    output_buffer_.append(data, size);
  } else {
    // Avoid printf and C strings, since the actual output might contain null
    // bytes like UTF-16 does (yuck).
    fwrite(data, 1, size, stdout);
  }
}